

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int read32bits(sqlite3_file *fd,i64 offset,u32 *pRes)

{
  int iVar1;
  uchar ac [4];
  uint local_c;
  
  iVar1 = (*fd->pMethods->xRead)(fd,&local_c,4,offset);
  if (iVar1 == 0) {
    *pRes = local_c >> 0x18 | (local_c & 0xff0000) >> 8 | (local_c & 0xff00) << 8 | local_c << 0x18;
  }
  return iVar1;
}

Assistant:

static int read32bits(sqlite3_file *fd, i64 offset, u32 *pRes){
  unsigned char ac[4];
  int rc = sqlite3OsRead(fd, ac, sizeof(ac), offset);
  if( rc==SQLITE_OK ){
    *pRes = sqlite3Get4byte(ac);
  }
  return rc;
}